

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Dn dn)

{
  Syntax SVar1;
  char *pcVar2;
  StrWriter *this_local;
  Dn dn_local;
  
  SVar1 = this->style->syntax;
  if (SVar1 == MOIRA_MIT) {
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = '%';
LAB_00137067:
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = 'D';
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = (char)dn.raw + '0';
  }
  else {
    if (SVar1 != GNU) {
      if (SVar1 != GNU_MIT) goto LAB_00137067;
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = '%';
    }
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = 'd';
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = (char)dn.raw + '0';
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Dn dn)
{
    switch (style.syntax) {

        case Syntax::GNU_MIT:      *ptr++ = '%'; [[fallthrough]];
       case Syntax::GNU:          *ptr++ = 'd'; *ptr++ = '0' + (char)dn.raw; break;
        case Syntax::MOIRA_MIT:    *ptr++ = '%'; [[fallthrough]];
        
        default:
            *ptr++ = 'D'; *ptr++ = '0' + (char)dn.raw; break;
    }

    return *this;
}